

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.c
# Opt level: O1

int factorf(int M)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = M * -0x49249249;
  while (iVar1 + 0x12492492U < 0x24924925) {
    M = M / 7;
    iVar1 = M * -0x49249249;
  }
  for (; M * -0x55555555 + 0x2aaaaaaaU < 0x55555555; M = M / 3) {
  }
  for (; M * -0x33333333 + 0x19999999U < 0x33333333; M = M / 5) {
  }
  do {
    uVar2 = M;
    M = (int)uVar2 >> 1;
  } while ((uVar2 & 1) == 0);
  return uVar2;
}

Assistant:

int factorf(int M) {
	int N;
	N = M;
	while (N%7 == 0){
			N = N/7;
		}
	while (N%3 == 0){
			N = N/3;
		}
	while (N%5 == 0){
			N = N/5;
		}
	while (N%2 == 0){
			N = N/2;
		}

	return N;
}